

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

time_t isodate7(uchar *v)

{
  int iVar1;
  time_t t;
  undefined1 local_50 [4];
  int offset;
  tm tm;
  uchar *v_local;
  
  tm.tm_zone = (char *)v;
  memset(local_50,0,0x38);
  tm.tm_mday = (int)(byte)*tm.tm_zone;
  tm.tm_hour = (byte)tm.tm_zone[1] - 1;
  tm.tm_min = (int)(byte)tm.tm_zone[2];
  tm.tm_sec = (int)(byte)tm.tm_zone[3];
  offset = (int)(byte)tm.tm_zone[4];
  local_50 = (undefined1  [4])(uint)(byte)tm.tm_zone[5];
  iVar1 = (int)tm.tm_zone[6];
  if ((-0x30 < iVar1) && (iVar1 < 0x34)) {
    tm.tm_sec = tm.tm_sec - iVar1 / 4;
    offset = offset + (iVar1 % 4) * -0xf;
  }
  v_local = (uchar *)time_from_tm((tm *)local_50);
  if (v_local == (uchar *)0xffffffffffffffff) {
    v_local = (uchar *)0x0;
  }
  return (time_t)v_local;
}

Assistant:

static time_t
isodate7(const unsigned char *v)
{
	struct tm tm;
	int offset;
	time_t t;

	memset(&tm, 0, sizeof(tm));
	tm.tm_year = v[0];
	tm.tm_mon = v[1] - 1;
	tm.tm_mday = v[2];
	tm.tm_hour = v[3];
	tm.tm_min = v[4];
	tm.tm_sec = v[5];
	/* v[6] is the signed timezone offset, in 1/4-hour increments. */
	offset = ((const signed char *)v)[6];
	if (offset > -48 && offset < 52) {
		tm.tm_hour -= offset / 4;
		tm.tm_min -= (offset % 4) * 15;
	}
	t = time_from_tm(&tm);
	if (t == (time_t)-1)
		return ((time_t)0);
	return (t);
}